

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O3

UnicodeString * __thiscall icu_63::UnicodeSetIterator::getString(UnicodeSetIterator *this)

{
  short sVar1;
  UChar32 srcChar;
  UnicodeString *pUVar2;
  int32_t _length;
  size_t in_RSI;
  
  if (this->string != (UnicodeString *)0x0) {
    return this->string;
  }
  pUVar2 = this->cpString;
  if (pUVar2 == (UnicodeString *)0x0) {
    pUVar2 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,in_RSI);
    if (pUVar2 == (UnicodeString *)0x0) {
      this->cpString = (UnicodeString *)0x0;
      pUVar2 = (UnicodeString *)0x0;
      goto LAB_002d3b27;
    }
    (pUVar2->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003be258;
    (pUVar2->fUnion).fStackFields.fLengthAndFlags = 2;
    this->cpString = pUVar2;
  }
  srcChar = this->codepoint;
  UnicodeString::unBogus(pUVar2);
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    _length = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    _length = (int)sVar1 >> 5;
  }
  UnicodeString::replace(pUVar2,0,_length,srcChar);
  pUVar2 = this->cpString;
LAB_002d3b27:
  this->string = pUVar2;
  return pUVar2;
}

Assistant:

const UnicodeString& UnicodeSetIterator::getString()  {
    if (string==NULL && codepoint!=(UChar32)IS_STRING) {
       if (cpString == NULL) {
          cpString = new UnicodeString();
       }
       if (cpString != NULL) {
          cpString->setTo((UChar32)codepoint);
       }
       string = cpString;
    }
    return *string;
}